

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::BlockEventListControl::fromSyntax
          (BlockEventExpressionSyntax *syntax,ASTContext *context)

{
  Compilation *comp;
  long lVar1;
  int iVar2;
  Expression *pEVar3;
  Symbol *pSVar4;
  undefined4 extraout_var;
  BlockEventListControl *pBVar5;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  SourceRange SVar6;
  SmallVector<slang::ast::BlockEventListControl::Event,_4UL> events;
  undefined1 local_b0 [8];
  __extent_storage<18446744073709551615UL> local_a8;
  SyntaxNode *local_a0;
  SmallVectorBase<slang::ast::BlockEventListControl::Event> local_98 [2];
  SourceRange local_40;
  
  comp = ((context->scope).ptr)->compilation;
  local_98[0].data_ = (pointer)local_98[0].firstElement;
  local_98[0].len = 0;
  local_98[0].cap = 4;
  local_a0 = &syntax->super_SyntaxNode;
  if ((syntax->super_SyntaxNode).kind == BinaryBlockEventExpression) {
    do {
      lVar1 = *(long *)&syntax[1].super_SyntaxNode;
      pEVar3 = ArbitrarySymbolExpression::fromSyntax
                         (comp,*(NameSyntax **)(lVar1 + 0x28),context,
                          (bitmask<slang::ast::LookupFlags>)0x0);
      pSVar4 = Expression::getSymbolReference(pEVar3,true);
      if (pSVar4 == (Symbol *)0x0) {
LAB_00302c51:
        local_b0 = (undefined1  [8])0x0;
        pBVar5 = (BlockEventListControl *)
                 BumpAllocator::
                 emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                           (&comp->super_BumpAllocator,(TimingControl **)local_b0);
        goto LAB_00302c65;
      }
      if ((pSVar4->kind != StatementBlock) && (pSVar4->kind != Subroutine)) {
        SVar6 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(lVar1 + 0x28));
        ASTContext::addDiag(context,(DiagCode)0x1f0008,SVar6);
        goto LAB_00302c51;
      }
      local_a8._M_extent_value._0_1_ = *(short *)(lVar1 + 0x18) == 0x69;
      local_b0 = (undefined1  [8])pEVar3;
      SmallVectorBase<slang::ast::BlockEventListControl::Event>::
      emplace_back<slang::ast::BlockEventListControl::Event>(local_98,(Event *)local_b0);
      syntax = *(BlockEventExpressionSyntax **)&syntax[2].super_SyntaxNode;
    } while ((syntax->super_SyntaxNode).kind == BinaryBlockEventExpression);
  }
  pEVar3 = ArbitrarySymbolExpression::fromSyntax
                     (comp,(NameSyntax *)syntax[1].super_SyntaxNode.previewNode,context,
                      (bitmask<slang::ast::LookupFlags>)0x0);
  pSVar4 = Expression::getSymbolReference(pEVar3,true);
  if (pSVar4 != (Symbol *)0x0) {
    if ((pSVar4->kind == StatementBlock) || (pSVar4->kind == Subroutine)) {
      local_a8._M_extent_value._0_1_ = (short)syntax[1].super_SyntaxNode.kind == CopyClassExpression
      ;
      local_b0 = (undefined1  [8])pEVar3;
      SmallVectorBase<slang::ast::BlockEventListControl::Event>::
      emplace_back<slang::ast::BlockEventListControl::Event>(local_98,(Event *)local_b0);
      iVar2 = SmallVectorBase<slang::ast::BlockEventListControl::Event>::copy
                        (local_98,(EVP_PKEY_CTX *)comp,src);
      local_b0 = (undefined1  [8])CONCAT44(extraout_var,iVar2);
      local_a8._M_extent_value = extraout_RDX;
      local_40 = slang::syntax::SyntaxNode::sourceRange(local_a0);
      pBVar5 = BumpAllocator::
               emplace<slang::ast::BlockEventListControl,std::span<slang::ast::BlockEventListControl::Event,18446744073709551615ul>,slang::SourceRange>
                         (&comp->super_BumpAllocator,
                          (span<slang::ast::BlockEventListControl::Event,_18446744073709551615UL> *)
                          local_b0,&local_40);
      goto LAB_00302c65;
    }
    SVar6 = slang::syntax::SyntaxNode::sourceRange(syntax[1].super_SyntaxNode.previewNode);
    ASTContext::addDiag(context,(DiagCode)0x1f0008,SVar6);
  }
  local_b0 = (undefined1  [8])0x0;
  pBVar5 = (BlockEventListControl *)
           BumpAllocator::
           emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                     (&comp->super_BumpAllocator,(TimingControl **)local_b0);
LAB_00302c65:
  if (local_98[0].data_ != (pointer)local_98[0].firstElement) {
    operator_delete(local_98[0].data_);
  }
  return &pBVar5->super_TimingControl;
}

Assistant:

TimingControl& BlockEventListControl::fromSyntax(const BlockEventExpressionSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    SmallVector<Event, 4> events;

    auto addEvent = [&](const PrimaryBlockEventExpressionSyntax& evSyntax) {
        auto& expr = ArbitrarySymbolExpression::fromSyntax(comp, *evSyntax.name, context);
        if (auto symbol = expr.getSymbolReference()) {
            if (symbol->kind != SymbolKind::StatementBlock &&
                symbol->kind != SymbolKind::Subroutine) {
                context.addDiag(diag::InvalidBlockEventTarget, evSyntax.name->sourceRange());
                return false;
            }

            events.push_back({&expr, evSyntax.keyword.kind == TokenKind::BeginKeyword});
            return true;
        }

        return false;
    };

    const BlockEventExpressionSyntax* curr = &syntax;
    while (curr->kind == SyntaxKind::BinaryBlockEventExpression) {
        auto& bin = curr->as<BinaryBlockEventExpressionSyntax>();
        if (!addEvent(bin.left->as<PrimaryBlockEventExpressionSyntax>()))
            return badCtrl(comp, nullptr);

        curr = bin.right;
    }

    if (!addEvent(curr->as<PrimaryBlockEventExpressionSyntax>()))
        return badCtrl(comp, nullptr);

    return *comp.emplace<BlockEventListControl>(events.copy(comp), syntax.sourceRange());
}